

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ElementSelectSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ElementSelectSyntax,slang::syntax::ElementSelectSyntax_const&>
          (BumpAllocator *this,ElementSelectSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  Info *pIVar3;
  SelectorSyntax *pSVar4;
  Info *pIVar5;
  undefined4 uVar6;
  TokenKind TVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  TokenKind TVar11;
  undefined1 uVar12;
  NumericTokenFlags NVar13;
  uint32_t uVar14;
  ElementSelectSyntax *pEVar15;
  
  pEVar15 = (ElementSelectSyntax *)allocate(this,0x40,8);
  uVar6 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
  pSVar1 = (args->super_SyntaxNode).parent;
  pSVar2 = (args->super_SyntaxNode).previewNode;
  TVar7 = (args->openBracket).kind;
  uVar8 = (args->openBracket).field_0x2;
  NVar9.raw = (args->openBracket).numFlags.raw;
  uVar10 = (args->openBracket).rawLen;
  pIVar3 = (args->openBracket).info;
  pSVar4 = args->selector;
  TVar11 = (args->closeBracket).kind;
  uVar12 = (args->closeBracket).field_0x2;
  NVar13.raw = (args->closeBracket).numFlags.raw;
  uVar14 = (args->closeBracket).rawLen;
  pIVar5 = (args->closeBracket).info;
  (pEVar15->super_SyntaxNode).kind = (args->super_SyntaxNode).kind;
  *(undefined4 *)&(pEVar15->super_SyntaxNode).field_0x4 = uVar6;
  (pEVar15->super_SyntaxNode).parent = pSVar1;
  (pEVar15->super_SyntaxNode).previewNode = pSVar2;
  (pEVar15->openBracket).kind = TVar7;
  (pEVar15->openBracket).field_0x2 = uVar8;
  (pEVar15->openBracket).numFlags = (NumericTokenFlags)NVar9.raw;
  (pEVar15->openBracket).rawLen = uVar10;
  (pEVar15->openBracket).info = pIVar3;
  pEVar15->selector = pSVar4;
  (pEVar15->closeBracket).kind = TVar11;
  (pEVar15->closeBracket).field_0x2 = uVar12;
  (pEVar15->closeBracket).numFlags = (NumericTokenFlags)NVar13.raw;
  (pEVar15->closeBracket).rawLen = uVar14;
  (pEVar15->closeBracket).info = pIVar5;
  return pEVar15;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }